

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.c
# Opt level: O0

int json_dump_file(json_t *json,char *path,size_t flags)

{
  int iVar1;
  FILE *__stream;
  FILE *output;
  int result;
  size_t flags_local;
  char *path_local;
  json_t *json_local;
  
  __stream = fopen(path,"w");
  if (__stream == (FILE *)0x0) {
    json_local._4_4_ = -1;
  }
  else {
    json_local._4_4_ = json_dumpf(json,(FILE *)__stream,flags);
    iVar1 = fclose(__stream);
    if (iVar1 != 0) {
      json_local._4_4_ = -1;
    }
  }
  return json_local._4_4_;
}

Assistant:

int json_dump_file(const json_t *json, const char *path, size_t flags) {
    int result;

    FILE *output = fopen(path, "w");
    if (!output)
        return -1;

    result = json_dumpf(json, output, flags);

    if (fclose(output) != 0)
        return -1;

    return result;
}